

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

void __thiscall BackwardPass::MarkTempProcessInstr(BackwardPass *this,Instr *instr)

{
  BasicBlock *pBVar1;
  code *pcVar2;
  bool bVar3;
  Phase PVar4;
  undefined4 *puVar5;
  
  if (this->isCollectionPass == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x192d,"(!IsCollectionPass())","!IsCollectionPass()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pBVar1 = this->currentBlock;
  if ((pBVar1->field_0x18 & 2) == 0) {
    PVar4 = this->tag;
    if (PVar4 == BackwardPhase) {
      bVar3 = SatisfyMarkTempObjectsConditions(this);
      if (bVar3) {
        ObjectTemp::ProcessInstr(instr);
      }
      PVar4 = this->tag;
    }
    if (PVar4 == DeadStorePhase) {
      bVar3 = SatisfyMarkTempObjectsConditions(this);
      if (bVar3) {
        ObjectTempVerify::ProcessInstr
                  (&pBVar1->tempObjectVerifyTracker->super_ObjectTempVerify,instr,this);
        return;
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::MarkTempProcessInstr(IR::Instr * instr)
{
    Assert(!IsCollectionPass());

    if (this->currentBlock->isDead)
    {
        return;
    }

    BasicBlock * block;
    block = this->currentBlock;
    if (this->DoMarkTempNumbers())
    {
        block->tempNumberTracker->ProcessInstr(instr, this);
    }

    if (this->DoMarkTempObjects())
    {
        block->tempObjectTracker->ProcessInstr(instr);
    }

#if DBG
    if (this->DoMarkTempObjectVerify())
    {
        block->tempObjectVerifyTracker->ProcessInstr(instr, this);
    }
#endif
}